

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaBuildCommand.cpp
# Opt level: O2

bool __thiscall
llbuild::commands::executeNinjaBuildCommand(std::vector<std::__cxx11::string,std::allocator<std::
__cxx11::string>>)::NinjaCompositeResultRule::isResultValid(llbuild::core::BuildEngine&,std::
vector<unsigned_char,std::allocator<unsigned_char>_>_const__
          (void *this,BuildEngine *param_1,ValueType *value)

{
  long lVar1;
  CommandSignature CVar2;
  hash_code hVar3;
  size_t extraout_RDX;
  bool bVar4;
  StringRef S;
  BuildValue value_1;
  BuildValue local_70;
  
  bVar4 = true;
  if (*(char *)(*(long *)((long)this + 0x30) + 0x91) == '\0') {
    lVar1 = *(long *)((long)this + 0x38);
    anon_unknown.dwarf_988a7::BuildValue::fromValue(&local_70,value);
    if (local_70.kind == SuccessfulCommand) {
      CVar2 = anon_unknown.dwarf_988a7::BuildValue::getCommandHash(&local_70);
      S.Length = extraout_RDX;
      S.Data = *(char **)(lVar1 + 0x78);
      hVar3 = llvm::hash_value(*(llvm **)(lVar1 + 0x70),S);
      bVar4 = CVar2.value == hVar3.value;
    }
    else {
      bVar4 = false;
    }
    anon_unknown.dwarf_988a7::BuildValue::~BuildValue(&local_70);
  }
  return bVar4;
}

Assistant:

bool isResultValid(core::BuildEngine&, const core::ValueType& value) override {
        // If simulating, assume cached results are valid.
        if (context.simulate)
          return true;

        return selectCompositeIsResultValid(command, value);
      }